

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O0

RefPtr<wabt::interp::Memory> * __thiscall
wabt::interp::Store::Alloc<wabt::interp::Memory,wabt::interp::Store&,wabt::interp::MemoryType&>
          (RefPtr<wabt::interp::Memory> *__return_storage_ptr__,Store *this,Store *args,
          MemoryType *args_1)

{
  Memory *pMVar1;
  Index index;
  MemoryType local_60;
  Memory *local_38;
  Ref local_30;
  Ref ref;
  MemoryType *args_local_1;
  Store *args_local;
  Store *this_local;
  RefPtr<wabt::interp::Memory> *ptr;
  
  ref.index = (size_t)args_1;
  pMVar1 = (Memory *)operator_new(0x88);
  MemoryType::MemoryType(&local_60,(MemoryType *)ref.index);
  Memory::Memory(pMVar1,args,&local_60);
  local_38 = pMVar1;
  index = FreeList<std::unique_ptr<wabt::interp::Object,std::default_delete<wabt::interp::Object>>>
          ::New<wabt::interp::Memory*>
                    ((FreeList<std::unique_ptr<wabt::interp::Object,std::default_delete<wabt::interp::Object>>>
                      *)&this->objects_,&local_38);
  Ref::Ref(&local_30,index);
  MemoryType::~MemoryType(&local_60);
  RefPtr<wabt::interp::Memory>::RefPtr(__return_storage_ptr__,this,local_30);
  pMVar1 = RefPtr<wabt::interp::Memory>::operator->(__return_storage_ptr__);
  (pMVar1->super_Extern).super_Object.self_.index = local_30.index;
  return __return_storage_ptr__;
}

Assistant:

RefPtr<T> Store::Alloc(Args&&... args) {
  Ref ref{objects_.New(new T(std::forward<Args>(args)...))};
  RefPtr<T> ptr{*this, ref};
  ptr->self_ = ref;
  return ptr;
}